

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::PrintMessageDescriptors(Generator *this)

{
  int iVar1;
  Descriptor *message_descriptor;
  int local_14;
  int i;
  Generator *this_local;
  
  local_14 = 0;
  while( true ) {
    iVar1 = FileDescriptor::message_type_count(this->file_);
    if (iVar1 <= local_14) break;
    message_descriptor = FileDescriptor::message_type(this->file_,local_14);
    PrintDescriptor(this,message_descriptor);
    google::protobuf::io::Printer::Print((char *)this->printer_);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void Generator::PrintMessageDescriptors() const {
  for (int i = 0; i < file_->message_type_count(); ++i) {
    PrintDescriptor(*file_->message_type(i));
    printer_->Print("\n");
  }
}